

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
visit_typed_array(typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *this,span<const_unsigned_short,_18446744073709551615UL> *data,
                 semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__x;
  span<const_unsigned_short,_18446744073709551615UL> *in_RSI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  allocator_type *in_stack_ffffffffffffffb8;
  unsigned_short *in_stack_ffffffffffffffc0;
  unsigned_short *in_stack_ffffffffffffffc8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffd0;
  
  detail::span<const_unsigned_short,_18446744073709551615UL>::begin(in_RSI);
  __x = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
        detail::span<const_unsigned_short,_18446744073709551615UL>::end(in_RSI);
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&stack0xffffffffffffffbf;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x3a91e4);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=(this_00,__x);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(this_00);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x3a9225);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const value_type>& data,  
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_ = std::vector<value_type>(data.begin(),data.end());
            JSONCONS_VISITOR_RETURN;
        }